

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O2

void llama_sampler_logit_bias_free(llama_sampler *smpl)

{
  llama_sampler_logit_bias *this;
  
  this = (llama_sampler_logit_bias *)smpl->ctx;
  if (this != (llama_sampler_logit_bias *)0x0) {
    llama_sampler_logit_bias::~llama_sampler_logit_bias(this);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

static void llama_sampler_logit_bias_free(struct llama_sampler * smpl) {
    delete (llama_sampler_logit_bias *) smpl->ctx;
}